

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

bool __thiscall QDockAreaLayoutInfo::updateTabBar(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  QMainWindowLayout *this_01;
  QTabBar *pQVar6;
  quintptr id;
  undefined4 extraout_var;
  QDockWidget *pQVar7;
  undefined4 extraout_var_00;
  ulong uVar8;
  unsigned_long_long uVar9;
  quintptr qVar10;
  QDockWidgetGroupWindow *this_02;
  QObject *o;
  long lVar11;
  int iVar12;
  long in_FS_OFFSET;
  ulonglong local_b0;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_68 [16];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == true) {
    o = (QObject *)this->tabBar;
    if (o == (QObject *)0x0) {
      this_01 = mainWindowLayout(this);
      pQVar6 = QMainWindowLayout::getTabBar((QMainWindowLayout *)this_01);
      this->tabBar = pQVar6;
      QTabBar::setShape(pQVar6,this->tabBarShape);
      QTabBar::setDrawBase(this->tabBar,true);
      o = (QObject *)this->tabBar;
    }
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_68,o);
    id = currentTabId(this);
    lVar11 = 0;
    iVar12 = 0;
    bVar4 = 0;
    for (uVar8 = 0; uVar8 < (ulong)(this->item_list).d.size; uVar8 = uVar8 + 1) {
      pQVar1 = (this->item_list).d.ptr;
      this_00 = (QDockAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar11);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar3) {
        if ((*(byte *)((long)&pQVar1->flags + lVar11) & 1) == 0) {
          if (this_00->widgetItem != (QLayoutItem *)0x0) {
            iVar5 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
            pQVar7 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>
                               ((QObject *)CONCAT44(extraout_var,iVar5));
            lVar2 = *(long *)&(pQVar7->super_QWidget).field_0x8;
            local_88.d = *(Data **)(lVar2 + 0x290);
            local_88.ptr = *(char16_t **)(lVar2 + 0x298);
            local_88.size = *(qsizetype *)(lVar2 + 0x2a0);
            if (local_88.d != (Data *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (this_00->widgetItem == (QLayoutItem *)0x0) {
              local_b0 = 0;
            }
            else {
              iVar5 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
              local_b0 = CONCAT44(extraout_var_00,iVar5);
            }
            iVar5 = QTabBar::count(this->tabBar);
            if (iVar12 == iVar5) {
              QTabBar::insertTab(this->tabBar,iVar12,(QString *)&local_88);
              pQVar6 = this->tabBar;
LAB_003cb77f:
              QTabBar::setTabToolTip(pQVar6,iVar12,(QString *)&local_88);
              pQVar6 = this->tabBar;
              ::QVariant::QVariant(&local_58,local_b0);
              QTabBar::setTabData(pQVar6,iVar12,&local_58);
              ::QVariant::~QVariant(&local_58);
            }
            else {
              QTabBar::tabData(&local_58,this->tabBar,iVar12);
              uVar9 = qvariant_cast<unsigned_long_long>(&local_58);
              ::QVariant::~QVariant(&local_58);
              if (uVar9 != local_b0) {
                iVar5 = QTabBar::count(this->tabBar);
                if (iVar12 + 1 < iVar5) {
                  QTabBar::tabData(&local_58,this->tabBar,iVar12 + 1);
                  uVar9 = qvariant_cast<unsigned_long_long>(&local_58);
                  ::QVariant::~QVariant(&local_58);
                  if (uVar9 == local_b0) {
                    QTabBar::removeTab(this->tabBar,iVar12);
                    goto LAB_003cb7b6;
                  }
                }
                QTabBar::insertTab(this->tabBar,iVar12,(QString *)&local_88);
                pQVar6 = this->tabBar;
                goto LAB_003cb77f;
              }
            }
LAB_003cb7b6:
            QTabBar::tabText((QString *)&local_58,this->tabBar,iVar12);
            bVar3 = ::operator!=((QString *)&local_88,(QString *)&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
            if (bVar3) {
              QTabBar::setTabText(this->tabBar,iVar12,(QString *)&local_88);
              QTabBar::setTabToolTip(this->tabBar,iVar12,(QString *)&local_88);
            }
            iVar12 = iVar12 + 1;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          }
        }
        else {
          bVar4 = 1;
        }
      }
      lVar11 = lVar11 + 0x28;
    }
    while (iVar5 = QTabBar::count(this->tabBar), iVar12 < iVar5) {
      QTabBar::removeTab(this->tabBar,iVar12);
    }
    if ((id != 0) && (qVar10 = currentTabId(this), qVar10 != id)) {
      setCurrentTabId(this,id);
    }
    this_02 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                        (*(QObject **)(*(long *)&(this->tabBar->super_QWidget).field_0x8 + 0x10));
    if (this_02 != (QDockWidgetGroupWindow *)0x0) {
      QDockWidgetGroupWindow::adjustFlags((QDockWidgetGroupWindow *)this_02);
    }
    iVar12 = QTabBar::count(this->tabBar);
    bVar3 = 1 < (int)(iVar12 + (uint)bVar4);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_68);
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QDockAreaLayoutInfo::updateTabBar() const
{
    if (!tabbed)
        return false;

    QDockAreaLayoutInfo *that = const_cast<QDockAreaLayoutInfo*>(this);

    if (that->tabBar == nullptr) {
        that->tabBar = mainWindowLayout()->getTabBar();
        that->tabBar->setShape(static_cast<QTabBar::Shape>(tabBarShape));
        that->tabBar->setDrawBase(true);
    }

    const QSignalBlocker blocker(tabBar);
    bool gap = false;

    const quintptr oldCurrentId = currentTabId();

    int tab_idx = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;
        if (item.flags & QDockAreaLayoutItem::GapItem) {
            gap = true;
            continue;
        }
        if (item.widgetItem == nullptr)
            continue;

        QDockWidget *dw = qobject_cast<QDockWidget*>(item.widgetItem->widget());
        QString title = dw->d_func()->fixedWindowTitle;
        quintptr id = tabId(item);
        if (tab_idx == tabBar->count()) {
            tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
            tabBar->setTabData(tab_idx, id);
        } else if (qvariant_cast<quintptr>(tabBar->tabData(tab_idx)) != id) {
            if (tab_idx + 1 < tabBar->count()
                    && qvariant_cast<quintptr>(tabBar->tabData(tab_idx + 1)) == id)
                tabBar->removeTab(tab_idx);
            else {
                tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
                tabBar->setTabToolTip(tab_idx, title);
#endif
                tabBar->setTabData(tab_idx, id);
            }
        }

        if (title != tabBar->tabText(tab_idx)) {
            tabBar->setTabText(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
        }

        ++tab_idx;
    }

    while (tab_idx < tabBar->count()) {
        tabBar->removeTab(tab_idx);
    }

    if (oldCurrentId > 0 && currentTabId() != oldCurrentId)
        that->setCurrentTabId(oldCurrentId);

    if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(tabBar->parent()))
        dwgw->adjustFlags();

    //returns if the tabbar is visible or not
    return ( (gap ? 1 : 0) + tabBar->count()) > 1;
}